

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O0

void __thiscall
jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::uninitialized_move
          (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *this,
          basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *other)

{
  json_storage_kind jVar1;
  bool bVar2;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_RSI;
  undefined8 *in_RDI;
  
  jVar1 = storage_kind(in_RSI);
  bVar2 = is_trivial_storage(jVar1);
  if (!bVar2) {
    jVar1 = storage_kind(in_RSI);
    (*(code *)(&DAT_00ea607c + *(int *)(&DAT_00ea607c + (ulong)(byte)(jVar1 - byte_str) * 4)))();
    return;
  }
  *in_RDI = *(undefined8 *)&in_RSI->field_0;
  in_RDI[1] = (in_RSI->field_0).int64_.val_;
  return;
}

Assistant:

void uninitialized_move(basic_json&& other) noexcept
        {
            if (is_trivial_storage(other.storage_kind()))
            {
                std::memcpy(static_cast<void*>(this), &other, sizeof(basic_json));
            }
            else
            {
                switch (other.storage_kind())
                {
                    case json_storage_kind::long_str:
                        construct<long_string_storage>(other.cast<long_string_storage>());
                        other.construct<null_storage>();
                        break;
                    case json_storage_kind::byte_str:
                        construct<byte_string_storage>(other.cast<byte_string_storage>());
                        other.construct<null_storage>();
                        break;
                    case json_storage_kind::array:
                        construct<array_storage>(other.cast<array_storage>());
                        other.construct<null_storage>();
                        break;
                    case json_storage_kind::object:
                        construct<object_storage>(other.cast<object_storage>());
                        other.construct<null_storage>();
                        break;
                    default:
                        JSONCONS_UNREACHABLE();
                        break;
                }
            }
        }